

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ulong uVar1;
  ZSTD_CCtx_params local_c0;
  
  uVar1 = 0xffffffffffffffd6;
  if ((((0xffffffe9 < params.cParams.windowLog - 0x20) &&
       (0xffffffe6 < params.cParams.chainLog - 0x1f)) &&
      (0xffffffe6 < params.cParams.hashLog - 0x1f)) &&
     (((0xffffffe1 < params.cParams.searchLog - 0x1f && (0xfffffffa < params.cParams.minMatch - 8))
      && (params.cParams.targetLength < 0x20001)))) {
    uVar1 = 0xffffffffffffffd6;
    if (0xfffffff6 < params.cParams.strategy + ~ZSTD_btultra2) {
      uVar1 = 0;
    }
  }
  if (uVar1 < 0xffffffffffffff89) {
    ZSTD_assignParamsToCCtxParams(&local_c0,&cctx->requestedParams,&params);
    uVar1 = ZSTD_compress_advanced_internal
                      (cctx,dst,dstCapacity,src,srcSize,dict,dictSize,&local_c0);
  }
  return uVar1;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    FORWARD_IF_ERROR(ZSTD_checkCParams(params.cParams));
    return ZSTD_compress_internal(cctx,
                                  dst, dstCapacity,
                                  src, srcSize,
                                  dict, dictSize,
                                  &params);
}